

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::StringFormatTask::checkArguments
          (StringFormatTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Args *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  size_t in_R8;
  SystemSubroutine *in_R9;
  Type *ft;
  size_t i;
  Compilation *comp;
  Type *pTVar2;
  size_type in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff78;
  DiagCode in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  Diagnostic *in_stack_ffffffffffffffa0;
  ASTContext *context_00;
  size_t in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0x9a1151);
  pTVar2 = (Type *)0x7fffffff;
  callRange.endLoc = in_RSI;
  callRange.startLoc = in_RDX;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R9,(ASTContext *)this_00,SUB81(in_R8 >> 0x38,0),in_RCX,callRange,in_R8,
                     in_stack_fffffffffffffff8);
  if (bVar1) {
    for (context_00 = (ASTContext *)0x0; context_00 < (ASTContext *)0x2;
        context_00 = (ASTContext *)((long)&(context_00->scope).ptr + 1)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                 (size_type)context_00);
      in_stack_ffffffffffffffa0 =
           (Diagnostic *)
           not_null<const_slang::ast::Type_*>::operator*
                     ((not_null<const_slang::ast::Type_*> *)0x9a11f5);
      bVar1 = Type::canBeStringLike(pTVar2);
      if (!bVar1) {
        uVar3 = 0x1b000b;
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,
                   (size_type)context_00);
        sourceRange.endLoc = in_stack_ffffffffffffff78;
        sourceRange.startLoc = in_RDI;
        ASTContext::addDiag((ASTContext *)in_RSI,in_stack_ffffffffffffff84,sourceRange);
        ast::operator<<(in_stack_ffffffffffffffa0,(Type *)CONCAT44(uVar3,in_stack_ffffffffffffff98))
        ;
        pTVar2 = Compilation::getErrorType(this_00);
        return pTVar2;
      }
    }
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RSI,
               in_stack_ffffffffffffff58,(size_type)pTVar2);
    bVar1 = FmtHelpers::checkSFormatArgs(context_00,(Args *)in_stack_ffffffffffffffa0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pTVar2 = Compilation::getVoidType(this_00);
    }
    else {
      pTVar2 = Compilation::getErrorType(this_00);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < 2; i++) {
            const Type& ft = *args[i]->type;
            if (!ft.canBeStringLike()) {
                context.addDiag(diag::InvalidStringArg, args[i]->sourceRange) << ft;
                return comp.getErrorType();
            }
        }

        if (!FmtHelpers::checkSFormatArgs(context, args.subspan(1)))
            return comp.getErrorType();

        return comp.getVoidType();
    }